

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void load_GL_OES_texture_3D(GLADloadproc load)

{
  code *in_RDI;
  
  if (GLAD_GL_OES_texture_3D != 0) {
    glad_glTexImage3DOES = (PFNGLTEXIMAGE3DOESPROC)(*in_RDI)("glTexImage3DOES");
    glad_glTexSubImage3DOES = (PFNGLTEXSUBIMAGE3DOESPROC)(*in_RDI)("glTexSubImage3DOES");
    glad_glCopyTexSubImage3DOES = (PFNGLCOPYTEXSUBIMAGE3DOESPROC)(*in_RDI)("glCopyTexSubImage3DOES")
    ;
    glad_glCompressedTexImage3DOES =
         (PFNGLCOMPRESSEDTEXIMAGE3DOESPROC)(*in_RDI)("glCompressedTexImage3DOES");
    glad_glCompressedTexSubImage3DOES =
         (PFNGLCOMPRESSEDTEXSUBIMAGE3DOESPROC)(*in_RDI)("glCompressedTexSubImage3DOES");
    glad_glFramebufferTexture3DOES =
         (PFNGLFRAMEBUFFERTEXTURE3DOESPROC)(*in_RDI)("glFramebufferTexture3DOES");
  }
  return;
}

Assistant:

static void load_GL_OES_texture_3D(GLADloadproc load) {
	if(!GLAD_GL_OES_texture_3D) return;
	glad_glTexImage3DOES = (PFNGLTEXIMAGE3DOESPROC)load("glTexImage3DOES");
	glad_glTexSubImage3DOES = (PFNGLTEXSUBIMAGE3DOESPROC)load("glTexSubImage3DOES");
	glad_glCopyTexSubImage3DOES = (PFNGLCOPYTEXSUBIMAGE3DOESPROC)load("glCopyTexSubImage3DOES");
	glad_glCompressedTexImage3DOES = (PFNGLCOMPRESSEDTEXIMAGE3DOESPROC)load("glCompressedTexImage3DOES");
	glad_glCompressedTexSubImage3DOES = (PFNGLCOMPRESSEDTEXSUBIMAGE3DOESPROC)load("glCompressedTexSubImage3DOES");
	glad_glFramebufferTexture3DOES = (PFNGLFRAMEBUFFERTEXTURE3DOESPROC)load("glFramebufferTexture3DOES");
}